

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_option.hpp
# Opt level: O1

string * __thiscall
duckdb::CSVOption<unsigned_long>::FormatValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,CSVOption<unsigned_long> *this,idx_t *val)

{
  ulong __val;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  string *__str;
  char cVar4;
  
  __val = *val;
  cVar4 = '\x01';
  if (9 < __val) {
    uVar3 = __val;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (uVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_01539d4a;
      }
      if (uVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_01539d4a;
      }
      if (uVar3 < 10000) goto LAB_01539d4a;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_01539d4a:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar4);
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p,
             (uint)__return_storage_ptr__->_M_string_length,__val);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatValueInternal(const idx_t &val) const {
		return to_string(val);
	}